

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_sub_digits(sexp ctx,sexp dst,sexp a,sexp b)

{
  long lVar1;
  sexp b_00;
  sexp psVar2;
  sexp_sint_t sVar3;
  sexp psVar4;
  sexp in_RCX;
  sexp in_RDX;
  sexp in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp c;
  sexp_uint_t *cdata;
  sexp_uint_t *bdata;
  sexp_uint_t *adata;
  sexp_uint_t i;
  sexp_uint_t borrow;
  sexp_uint_t blen;
  sexp_uint_t alen;
  sexp local_80;
  undefined1 *len0;
  sexp in_stack_ffffffffffffff90;
  sexp a_00;
  sexp a_01;
  sexp in_stack_ffffffffffffffa0;
  sexp local_48;
  long local_40;
  sexp local_8;
  
  b_00 = (sexp)sexp_bignum_hi(in_RDX);
  psVar2 = (sexp)sexp_bignum_hi(in_RCX);
  local_40 = 0;
  a_01 = (sexp)&DAT_0000043e;
  memset(&stack0xffffffffffffff88,0,0x10);
  if ((b_00 < psVar2) ||
     ((local_80 = in_RSI, b_00 == psVar2 &&
      (sVar3 = sexp_bignum_compare_abs(a_01,in_stack_ffffffffffffff90), local_80 = in_RSI, sVar3 < 0
      )))) {
    local_8 = sexp_bignum_sub_digits(in_RSI,in_RDX,in_RCX,b_00);
  }
  else {
    len0 = &stack0xffffffffffffff98;
    a_00 = *(sexp *)(in_RDI + 0x6080);
    *(undefined1 **)(in_RDI + 0x6080) = &stack0xffffffffffffff88;
    if ((local_80 == (sexp)0x0) || (psVar4 = (sexp)sexp_bignum_hi(local_80), psVar4 < b_00)) {
      local_80 = sexp_copy_bignum(in_stack_ffffffffffffffa0,a_01,a_00,(sexp_uint_t)len0);
    }
    for (local_48 = (sexp)0x0; local_48 < psVar2; local_48 = (sexp)((long)&local_48->tag + 1)) {
      if ((*(ulong *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10) <
           *(ulong *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10)) ||
         ((*(long *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10) ==
           *(long *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10) && (local_40 == 0)))) {
        *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
             (*(long *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10) -
             *(long *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10)) - local_40;
        local_40 = 0;
      }
      else {
        *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
             -1 - *(long *)((long)&in_RCX->value + (long)local_48 * 8 + 0x10);
        *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
             *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) + 1;
        *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
             *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) - local_40;
        *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
             *(long *)((long)&in_RDX->value + (long)local_48 * 8 + 0x10) +
             *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10);
        local_40 = 1;
      }
    }
    while (local_40 != 0 && local_48 < b_00) {
      lVar1 = *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10);
      *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) =
           *(long *)((long)&local_80->value + (long)local_48 * 8 + 0x10) + -1;
      local_48 = (sexp)((long)&local_48->tag + 1);
      local_40 = (long)(int)(uint)(lVar1 == 0);
    }
    *(sexp *)(in_RDI + 0x6080) = a_00;
    local_8 = local_80;
  }
  return local_8;
}

Assistant:

sexp sexp_bignum_sub_digits (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b),
    borrow=0, i, *adata, *bdata, *cdata;
  sexp_gc_var1(c);
  if ((alen < blen) || ((alen == blen) && (sexp_bignum_compare_abs(a, b) < 0)))
    return sexp_bignum_sub_digits(ctx, dst, b, a);
  sexp_gc_preserve1(ctx, c);
  c = ((dst && sexp_bignum_hi(dst) >= alen)
       ? dst : sexp_copy_bignum(ctx, NULL, a, 0));
  adata = sexp_bignum_data(a);
  bdata = sexp_bignum_data(b);
  cdata = sexp_bignum_data(c);
  for (i=0; i<blen; i++) {
    if (adata[i] > bdata[i] || (adata[i] == bdata[i] && !borrow)) {
      cdata[i] = adata[i] - bdata[i] - borrow;
      borrow = 0;
    } else {
      cdata[i] = (SEXP_UINT_T_MAX - bdata[i]);
      cdata[i] += 1;
      cdata[i] -= borrow;
      cdata[i] += adata[i];
      borrow = 1;
    }
  }
  for ( ; borrow && (i<alen); i++) {
    borrow = (cdata[i] == 0 ? 1 : 0);
    cdata[i]--;
  }
  sexp_gc_release1(ctx);
  return c;
}